

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

void __thiscall lf::refinement::MeshHierarchy::RefineMarked(MeshHierarchy *this)

{
  RefPat RVar1;
  uint uVar2;
  Entity *pEVar3;
  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_> *pvVar4;
  vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_> *pvVar5;
  bool bVar6;
  RefElType RVar7;
  bool bVar8;
  RefElType RVar9;
  uint uVar10;
  int iVar11;
  value_type_conflict3 vVar12;
  __shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  size_type sVar13;
  runtime_error *prVar14;
  reference pvVar15;
  reference this_01;
  reference ppEVar16;
  undefined4 extraout_var;
  ostream *poVar17;
  reference ppEVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  reference this_02;
  reference pvVar22;
  reference pvVar23;
  reference __elements_1;
  reference __elements_2;
  string local_2928;
  allocator<char> local_2901;
  string local_2900;
  allocator<char> local_28d9;
  string local_28d8;
  stringstream local_28b8 [8];
  stringstream ss_19;
  ostream local_28a8 [376];
  string local_2730;
  allocator<char> local_2709;
  string local_2708;
  allocator<char> local_26e1;
  string local_26e0;
  stringstream local_26c0 [8];
  stringstream ss_18;
  ostream local_26b0 [376];
  string local_2538;
  allocator<char> local_2511;
  string local_2510;
  allocator<char> local_24e9;
  string local_24e8;
  stringstream local_24c8 [8];
  stringstream ss_17;
  ostream local_24b8 [376];
  string local_2340;
  allocator<char> local_2319;
  string local_2318;
  allocator<char> local_22f1;
  string local_22f0;
  stringstream local_22d0 [8];
  stringstream ss_16;
  ostream local_22c0 [376];
  string local_2148;
  allocator<char> local_2121;
  string local_2120;
  allocator<char> local_20f9;
  string local_20f8;
  stringstream local_20d8 [8];
  stringstream ss_15;
  ostream local_20c8 [376];
  string local_1f50;
  allocator<char> local_1f29;
  string local_1f28;
  allocator<char> local_1f01;
  string local_1f00;
  stringstream local_1ee0 [8];
  stringstream ss_14;
  ostream local_1ed0 [378];
  bool local_1d56;
  bool local_1d55;
  bool local_1d54;
  tuple<bool,_bool,_bool> local_1d53;
  string local_1d50;
  allocator<char> local_1d29;
  string local_1d28;
  allocator<char> local_1d01;
  string local_1d00;
  stringstream local_1ce0 [8];
  stringstream ss_13;
  ostream local_1cd0 [378];
  bool local_1b56;
  bool local_1b55;
  bool local_1b54;
  tuple<bool,_bool,_bool> local_1b53;
  string local_1b50;
  allocator<char> local_1b29;
  string local_1b28;
  allocator<char> local_1b01;
  string local_1b00;
  stringstream local_1ae0 [8];
  stringstream ss_12;
  ostream local_1ad0 [378];
  bool local_1956;
  bool local_1955;
  bool local_1954;
  tuple<bool,_bool,_bool> local_1953;
  string local_1950;
  allocator<char> local_1929;
  string local_1928;
  allocator<char> local_1901;
  string local_1900;
  stringstream local_18e0 [8];
  stringstream ss_11;
  ostream local_18d0 [378];
  bool local_1756;
  bool local_1755;
  bool local_1754;
  tuple<bool,_bool,_bool> local_1753;
  string local_1750;
  allocator<char> local_1729;
  string local_1728;
  allocator<char> local_1701;
  string local_1700;
  stringstream local_16e0 [8];
  stringstream ss_10;
  ostream local_16d0 [378];
  bool local_1556;
  bool local_1555;
  bool local_1554;
  tuple<bool,_bool,_bool> local_1553;
  string local_1550;
  allocator<char> local_1529;
  string local_1528;
  allocator<char> local_1501;
  string local_1500;
  stringstream local_14e0 [8];
  stringstream ss_9;
  ostream local_14d0 [378];
  bool local_1356;
  bool local_1355;
  bool local_1354;
  tuple<bool,_bool,_bool> local_1353;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  allocator<char> local_1301;
  string local_1300;
  stringstream local_12e0 [8];
  stringstream ss_8;
  ostream local_12d0 [378];
  bool local_1156;
  bool local_1155;
  bool local_1154;
  tuple<bool,_bool,_bool> local_1153;
  string local_1150;
  allocator<char> local_1129;
  string local_1128;
  allocator<char> local_1101;
  string local_1100;
  stringstream local_10e0 [8];
  stringstream ss_7;
  ostream local_10d0 [379];
  bool local_f55;
  bool local_f54;
  bool local_f53;
  tuple<bool,_bool,_bool> local_f52;
  tuple<bool,_bool,_bool> local_f4f;
  uint local_f4c;
  uint uStack_f48;
  tuple<bool,_bool,_bool> split_status;
  sub_idx_t mod_2;
  sub_idx_t mod_1;
  sub_idx_t mod_0;
  allocator<char> local_f19;
  string local_f18;
  allocator<char> local_ef1;
  string local_ef0;
  stringstream local_ed0 [8];
  stringstream ss_6;
  ostream local_ec0 [380];
  uint local_d44;
  RefEl local_d3d;
  sub_idx_t anchor;
  uint local_d38;
  glb_idx_t edge_index_1;
  int k;
  size_type split_edge_cnt;
  allocator<char> local_d09;
  string local_d08;
  allocator<char> local_ce1;
  string local_ce0;
  stringstream local_cc0 [8];
  stringstream ss_5;
  ostream local_cb0 [379];
  RefEl local_b35;
  size_type local_b34;
  undefined1 auStack_b30 [4];
  size_type num_edges;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_edges;
  array<unsigned_int,_4UL> split_edge_idx;
  array<bool,_4UL> edge_split;
  array<unsigned_int,_4UL> cell_edge_indices;
  CellChildInfo *cell_child_info;
  glb_idx_t cell_index;
  Entity *cell;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  undefined1 auStack_ab0 [7];
  bool refinement_complete;
  string local_aa0;
  allocator<char> local_a79;
  string local_a78;
  allocator<char> local_a51;
  string local_a50;
  stringstream local_a30 [8];
  stringstream ss_4;
  ostream local_a20 [376];
  reference local_8a8;
  EdgeChildInfo *ed_ci;
  undefined1 local_898 [4];
  glb_idx_t edge_index;
  allocator<char> local_871;
  string local_870;
  allocator<char> local_849;
  string local_848;
  stringstream local_828 [8];
  stringstream ss_3;
  ostream local_818 [382];
  RefEl local_69a;
  RefEl local_699;
  Entity *local_698;
  Entity *edge;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_1;
  PointChildInfo *pt_child_info;
  glb_idx_t point_index;
  Entity *point;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  stringstream local_5b8 [8];
  stringstream ss_2;
  ostream local_5a8 [376];
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  stringstream local_3c0 [8];
  stringstream ss_1;
  ostream local_3b0 [376];
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  reference local_30;
  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
  *finest_cell_ci;
  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
  *finest_edge_ci;
  vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
  *finest_point_ci;
  Mesh *finest_mesh;
  MeshHierarchy *this_local;
  
  finest_mesh = (Mesh *)this;
  this_00 = (__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
            ::back(&this->meshes_);
  finest_point_ci =
       (vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_> *)
       std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                 (this_00);
  finest_edge_ci =
       (vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_> *)
       std::
       vector<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
       ::back(&this->point_child_infos_);
  finest_cell_ci =
       (vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_> *)
       std::
       vector<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
       ::back(&this->edge_child_infos_);
  local_30 = std::
             vector<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
             ::back(&this->cell_child_infos_);
  sVar13 = std::
           vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>::
           size((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                 *)finest_edge_ci);
  uVar10 = (*(code *)(finest_point_ci->
                     super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start[3])(finest_point_ci,2);
  if (sVar13 != uVar10) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"length mismatch PointChildInfo vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"finest_point_ci.size() == finest_mesh.NumEntities(2)",
               &local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x7d,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"this code should not be reached");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar13 = std::
           vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>::
           size((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                 *)finest_cell_ci);
  uVar10 = (*(code *)(finest_point_ci->
                     super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start[3])(finest_point_ci,1);
  if (sVar13 != uVar10) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    std::operator<<(local_3b0,"length mismatch EdgeChildInfo vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"finest_edge_ci.size() == finest_mesh.NumEntities(1)",&local_3e1
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_409);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3e0,&local_408,0x7f,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"this code should not be reached");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar13 = std::
           vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>::
           size(local_30);
  uVar10 = (*(code *)(finest_point_ci->
                     super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start[3])(finest_point_ci,0);
  if (sVar13 != uVar10) {
    std::__cxx11::stringstream::stringstream(local_5b8);
    std::operator<<(local_5a8,"length mismatch CellChildInfo vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"finest_cell_ci.size() == finest_mesh.NumEntities(0)",&local_5d9
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_601);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_5d8,&local_600,0x81,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"this code should not be reached");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __begin2._M_current =
       (Entity **)
       (*(code *)(finest_point_ci->
                 super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[2])(finest_point_ci,2);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  point = (Entity *)
          std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while (bVar6 = __gnu_cxx::
                 operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                           (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     *)&point), ((bVar6 ^ 0xffU) & 1) != 0) {
    ppEVar16 = __gnu_cxx::
               __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
               ::operator*(&__end2);
    uVar10 = (*(code *)(finest_point_ci->
                       super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start[5])(finest_point_ci,*ppEVar16);
    pvVar15 = std::
              vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
              ::operator[]((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                            *)finest_edge_ci,(ulong)uVar10);
    pvVar15->ref_pat = rp_copy;
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  __begin2_1._M_current =
       (Entity **)
       (*(code *)(finest_point_ci->
                 super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[2])(finest_point_ci,1);
  __end2_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_1);
  edge = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_1);
  while( true ) {
    bVar6 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2_1,
                       (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        *)&edge);
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      do {
        bVar6 = true;
        __begin3._M_current =
             (Entity **)
             (*(code *)(finest_point_ci->
                       super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start[2])(finest_point_ci,0);
        __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3
                           );
        cell = (Entity *)
               std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
        while (bVar8 = __gnu_cxx::
                       operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                 (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                           *)&cell), ((bVar8 ^ 0xffU) & 1) != 0) {
          ppEVar16 = __gnu_cxx::
                     __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                     ::operator*(&__end3);
          pEVar3 = *ppEVar16;
          uVar10 = (*(code *)(finest_point_ci->
                             super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start[5])(finest_point_ci,pEVar3);
          std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
          ::operator[](local_30,(ulong)uVar10);
          memset(split_edge_idx._M_elems + 3,0,0x10);
          memset(split_edge_idx._M_elems + 2,0,4);
          memset((void *)((long)&sub_edges._M_extent._M_extent_value + 4),0,0x10);
          iVar11 = (*pEVar3->_vptr_Entity[1])(pEVar3,1);
          _auStack_b30 = (pointer)CONCAT44(extraout_var,iVar11);
          iVar11 = (*pEVar3->_vptr_Entity[4])();
          local_b35.type_ = (RefElType)iVar11;
          local_b34 = lf::base::RefEl::NumSubEntities(&local_b35,1);
          if (4 < local_b34) {
            std::__cxx11::stringstream::stringstream(local_cc0);
            poVar17 = std::operator<<(local_cb0,"Too many edges = ");
            std::ostream::operator<<(poVar17,local_b34);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ce0,"num_edges <= 4",&local_ce1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d08,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_d09);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_ce0,&local_d08,0xb4,(string *)&k);
            std::__cxx11::string::~string((string *)&k);
            std::__cxx11::string::~string((string *)&local_d08);
            std::allocator<char>::~allocator(&local_d09);
            std::__cxx11::string::~string((string *)&local_ce0);
            std::allocator<char>::~allocator(&local_ce1);
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar14,"this code should not be reached");
            __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          edge_index_1 = 0;
          for (local_d38 = 0; pvVar5 = finest_point_ci, local_d38 < local_b34;
              local_d38 = local_d38 + 1) {
            ppEVar18 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                  auStack_b30,(long)(int)local_d38);
            vVar12 = (*(code *)(pvVar5->
                               super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start[5])(pvVar5,*ppEVar18);
            anchor = vVar12;
            pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                ((array<unsigned_int,_4UL> *)(split_edge_idx._M_elems + 3),
                                 (long)(int)local_d38);
            *pvVar19 = vVar12;
            pvVar20 = std::
                      vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                      ::operator[]((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                                    *)finest_cell_ci,(ulong)anchor);
            RVar1 = pvVar20->ref_pat_;
            pvVar21 = std::array<bool,_4UL>::operator[]
                                ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),
                                 (long)(int)local_d38);
            *pvVar21 = RVar1 == rp_split;
            pvVar21 = std::array<bool,_4UL>::operator[]
                                ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),
                                 (long)(int)local_d38);
            uVar2 = local_d38;
            if ((*pvVar21 & 1U) != 0) {
              pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                  ((array<unsigned_int,_4UL> *)
                                   ((long)&sub_edges._M_extent._M_extent_value + 4),
                                   (ulong)edge_index_1);
              *pvVar19 = uVar2;
              edge_index_1 = edge_index_1 + 1;
            }
          }
          iVar11 = (*pEVar3->_vptr_Entity[4])();
          local_d3d.type_ = (RefElType)iVar11;
          RVar9 = lf::base::RefEl::operator_cast_to_RefElType(&local_d3d);
          if (RVar9 == kTria) {
            this_02 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::back(&this->refinement_edges_);
            pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (this_02,(ulong)uVar10);
            uVar2 = *pvVar22;
            local_d44 = uVar2;
            if (2 < uVar2) {
              std::__cxx11::stringstream::stringstream(local_ed0);
              poVar17 = std::operator<<(local_ec0,"Illegal anchor = ");
              std::ostream::operator<<(poVar17,local_d44);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_ef0,"anchor < 3",&local_ef1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f18,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_f19);
              std::__cxx11::stringstream::str();
              lf::base::AssertionFailed(&local_ef0,&local_f18,0xc9,(string *)&mod_1);
              std::__cxx11::string::~string((string *)&mod_1);
              std::__cxx11::string::~string((string *)&local_f18);
              std::allocator<char>::~allocator(&local_f19);
              std::__cxx11::string::~string((string *)&local_ef0);
              std::allocator<char>::~allocator(&local_ef1);
              prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar14,"this code should not be reached");
              __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pvVar23 = std::
                      vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                      ::operator[](local_30,(ulong)uVar10);
            pvVar23->anchor_ = uVar2;
            uStack_f48 = (local_d44 + 1) % 3;
            local_f4c = (local_d44 + 2) % 3;
            pvVar21 = std::array<bool,_4UL>::operator[]
                                ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),(ulong)local_d44)
            ;
            __elements_1 = std::array<bool,_4UL>::operator[]
                                     ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),
                                      (ulong)uStack_f48);
            __elements_2 = std::array<bool,_4UL>::operator[]
                                     ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),
                                      (ulong)local_f4c);
            std::tuple<bool,_bool,_bool>::tuple<bool_&,_bool_&,_bool_&,_true,_true>
                      (&local_f4f,pvVar21,__elements_1,__elements_2);
            local_f53 = false;
            local_f54 = false;
            local_f55 = false;
            std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                      (&local_f52,&local_f53,&local_f54,&local_f55);
            bVar8 = std::operator==(&local_f4f,&local_f52);
            if (bVar8) {
              if (edge_index_1 != 0) {
                std::__cxx11::stringstream::stringstream(local_10e0);
                std::operator<<(local_10d0,"Wrong number of split edges");
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1100,"split_edge_cnt == 0",&local_1101);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1128,
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                           ,&local_1129);
                std::__cxx11::stringstream::str();
                lf::base::AssertionFailed(&local_1100,&local_1128,0xde,&local_1150);
                std::__cxx11::string::~string((string *)&local_1150);
                std::__cxx11::string::~string((string *)&local_1128);
                std::allocator<char>::~allocator(&local_1129);
                std::__cxx11::string::~string((string *)&local_1100);
                std::allocator<char>::~allocator(&local_1101);
                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar14,"this code should not be reached");
                __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pvVar23 = std::
                        vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                        ::operator[](local_30,(ulong)uVar10);
              pvVar23->ref_pat_ = rp_copy;
            }
            else {
              local_1154 = true;
              local_1155 = false;
              local_1156 = false;
              std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                        (&local_1153,&local_1154,&local_1155,&local_1156);
              bVar8 = std::operator==(&local_f4f,&local_1153);
              if (bVar8) {
                if (edge_index_1 != 1) {
                  std::__cxx11::stringstream::stringstream(local_12e0);
                  std::operator<<(local_12d0,"Wrong number of split edges");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1300,"split_edge_cnt == 1",&local_1301);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1328,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,&local_1329);
                  std::__cxx11::stringstream::str();
                  lf::base::AssertionFailed(&local_1300,&local_1328,0xe4,&local_1350);
                  std::__cxx11::string::~string((string *)&local_1350);
                  std::__cxx11::string::~string((string *)&local_1328);
                  std::allocator<char>::~allocator(&local_1329);
                  std::__cxx11::string::~string((string *)&local_1300);
                  std::allocator<char>::~allocator(&local_1301);
                  prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar14,"this code should not be reached");
                  __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                pvVar23 = std::
                          vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                          ::operator[](local_30,(ulong)uVar10);
                pvVar23->ref_pat_ = rp_bisect;
              }
              else {
                local_1354 = true;
                local_1355 = true;
                local_1356 = false;
                std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                          (&local_1353,&local_1354,&local_1355,&local_1356);
                bVar8 = std::operator==(&local_f4f,&local_1353);
                if (bVar8) {
                  if (edge_index_1 != 2) {
                    std::__cxx11::stringstream::stringstream(local_14e0);
                    std::operator<<(local_14d0,"Wrong number of split edges");
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1500,"split_edge_cnt == 2",&local_1501);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1528,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,&local_1529);
                    std::__cxx11::stringstream::str();
                    lf::base::AssertionFailed(&local_1500,&local_1528,0xe9,&local_1550);
                    std::__cxx11::string::~string((string *)&local_1550);
                    std::__cxx11::string::~string((string *)&local_1528);
                    std::allocator<char>::~allocator(&local_1529);
                    std::__cxx11::string::~string((string *)&local_1500);
                    std::allocator<char>::~allocator(&local_1501);
                    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar14,"this code should not be reached");
                    __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  pvVar23 = std::
                            vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                            ::operator[](local_30,(ulong)uVar10);
                  pvVar23->ref_pat_ = rp_trisect;
                }
                else {
                  local_1554 = false;
                  local_1555 = true;
                  local_1556 = false;
                  std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                            (&local_1553,&local_1554,&local_1555,&local_1556);
                  bVar8 = std::operator==(&local_f4f,&local_1553);
                  if (bVar8) {
                    if (edge_index_1 != 1) {
                      std::__cxx11::stringstream::stringstream(local_16e0);
                      std::operator<<(local_16d0,"Wrong number of split edges");
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1700,"split_edge_cnt == 1",&local_1701);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1728,
                                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                 ,&local_1729);
                      std::__cxx11::stringstream::str();
                      lf::base::AssertionFailed(&local_1700,&local_1728,0xee,&local_1750);
                      std::__cxx11::string::~string((string *)&local_1750);
                      std::__cxx11::string::~string((string *)&local_1728);
                      std::allocator<char>::~allocator(&local_1729);
                      std::__cxx11::string::~string((string *)&local_1700);
                      std::allocator<char>::~allocator(&local_1701);
                      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar14,"this code should not be reached");
                      __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pvVar23 = std::
                              vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                              ::operator[](local_30,(ulong)uVar10);
                    pvVar4 = finest_cell_ci;
                    pvVar23->ref_pat_ = rp_trisect;
                    pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                        ((array<unsigned_int,_4UL> *)(split_edge_idx._M_elems + 3),
                                         (ulong)local_d44);
                    pvVar20 = std::
                              vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                              ::operator[]((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                                            *)pvVar4,(ulong)*pvVar19);
                    pvVar20->ref_pat_ = rp_split;
                    bVar6 = false;
                  }
                  else {
                    local_1754 = true;
                    local_1755 = false;
                    local_1756 = true;
                    std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                              (&local_1753,&local_1754,&local_1755,&local_1756);
                    bVar8 = std::operator==(&local_f4f,&local_1753);
                    if (bVar8) {
                      if (edge_index_1 != 2) {
                        std::__cxx11::stringstream::stringstream(local_18e0);
                        std::operator<<(local_18d0,"Wrong number of split edges");
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1900,"split_edge_cnt == 2",&local_1901);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1928,
                                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                   ,&local_1929);
                        std::__cxx11::stringstream::str();
                        lf::base::AssertionFailed(&local_1900,&local_1928,0xf6,&local_1950);
                        std::__cxx11::string::~string((string *)&local_1950);
                        std::__cxx11::string::~string((string *)&local_1928);
                        std::allocator<char>::~allocator(&local_1929);
                        std::__cxx11::string::~string((string *)&local_1900);
                        std::allocator<char>::~allocator(&local_1901);
                        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar14,"this code should not be reached")
                        ;
                        __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      pvVar23 = std::
                                vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                ::operator[](local_30,(ulong)uVar10);
                      pvVar23->ref_pat_ = rp_trisect_left;
                    }
                    else {
                      local_1954 = false;
                      local_1955 = false;
                      local_1956 = true;
                      std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                                (&local_1953,&local_1954,&local_1955,&local_1956);
                      bVar8 = std::operator==(&local_f4f,&local_1953);
                      if (bVar8) {
                        if (edge_index_1 != 1) {
                          std::__cxx11::stringstream::stringstream(local_1ae0);
                          std::operator<<(local_1ad0,"Wrong number of split edges");
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_1b00,"split_edge_cnt == 1",&local_1b01);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_1b28,
                                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                     ,&local_1b29);
                          std::__cxx11::stringstream::str();
                          lf::base::AssertionFailed(&local_1b00,&local_1b28,0xfc,&local_1b50);
                          std::__cxx11::string::~string((string *)&local_1b50);
                          std::__cxx11::string::~string((string *)&local_1b28);
                          std::allocator<char>::~allocator(&local_1b29);
                          std::__cxx11::string::~string((string *)&local_1b00);
                          std::allocator<char>::~allocator(&local_1b01);
                          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar14,"this code should not be reached");
                          __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        pvVar23 = std::
                                  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                  ::operator[](local_30,(ulong)uVar10);
                        pvVar4 = finest_cell_ci;
                        pvVar23->ref_pat_ = rp_trisect_left;
                        pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                            ((array<unsigned_int,_4UL> *)
                                             (split_edge_idx._M_elems + 3),(ulong)local_d44);
                        pvVar20 = std::
                                  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                                  ::operator[]((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                                                *)pvVar4,(ulong)*pvVar19);
                        pvVar20->ref_pat_ = rp_split;
                        bVar6 = false;
                      }
                      else {
                        local_1b54 = true;
                        local_1b55 = true;
                        local_1b56 = true;
                        std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                                  (&local_1b53,&local_1b54,&local_1b55,&local_1b56);
                        bVar8 = std::operator==(&local_f4f,&local_1b53);
                        if (bVar8) {
                          if (edge_index_1 != 3) {
                            std::__cxx11::stringstream::stringstream(local_1ce0);
                            std::operator<<(local_1cd0,"Wrong number of split edges");
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_1d00,"split_edge_cnt == 3",&local_1d01);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_1d28,
                                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                       ,&local_1d29);
                            std::__cxx11::stringstream::str();
                            lf::base::AssertionFailed(&local_1d00,&local_1d28,0x107,&local_1d50);
                            std::__cxx11::string::~string((string *)&local_1d50);
                            std::__cxx11::string::~string((string *)&local_1d28);
                            std::allocator<char>::~allocator(&local_1d29);
                            std::__cxx11::string::~string((string *)&local_1d00);
                            std::allocator<char>::~allocator(&local_1d01);
                            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar14,"this code should not be reached");
                            __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          pvVar23 = std::
                                    vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                    ::operator[](local_30,(ulong)uVar10);
                          pvVar23->ref_pat_ = rp_regular;
                        }
                        else {
                          local_1d54 = false;
                          local_1d55 = true;
                          local_1d56 = true;
                          std::tuple<bool,_bool,_bool>::tuple<bool,_bool,_bool,_true,_true>
                                    (&local_1d53,&local_1d54,&local_1d55,&local_1d56);
                          bVar6 = std::operator==(&local_f4f,&local_1d53);
                          if (!bVar6) {
                            std::__cxx11::stringstream::stringstream(local_20d8);
                            std::operator<<(local_20c8,"Impossible case");
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_20f8,"false",&local_20f9);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_2120,
                                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                       ,&local_2121);
                            std::__cxx11::stringstream::str();
                            lf::base::AssertionFailed(&local_20f8,&local_2120,0x115,&local_2148);
                            std::__cxx11::string::~string((string *)&local_2148);
                            std::__cxx11::string::~string((string *)&local_2120);
                            std::allocator<char>::~allocator(&local_2121);
                            std::__cxx11::string::~string((string *)&local_20f8);
                            std::allocator<char>::~allocator(&local_20f9);
                            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar14,"this code should not be reached");
                            __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          if (edge_index_1 != 2) {
                            std::__cxx11::stringstream::stringstream(local_1ee0);
                            std::operator<<(local_1ed0,"Wrong number of split edges");
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_1f00,"split_edge_cnt == 2",&local_1f01);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_1f28,
                                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                       ,&local_1f29);
                            std::__cxx11::stringstream::str();
                            lf::base::AssertionFailed(&local_1f00,&local_1f28,0x10f,&local_1f50);
                            std::__cxx11::string::~string((string *)&local_1f50);
                            std::__cxx11::string::~string((string *)&local_1f28);
                            std::allocator<char>::~allocator(&local_1f29);
                            std::__cxx11::string::~string((string *)&local_1f00);
                            std::allocator<char>::~allocator(&local_1f01);
                            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar14,"this code should not be reached");
                            __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          pvVar23 = std::
                                    vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                    ::operator[](local_30,(ulong)uVar10);
                          pvVar4 = finest_cell_ci;
                          pvVar23->ref_pat_ = rp_quadsect;
                          pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                              ((array<unsigned_int,_4UL> *)
                                               (split_edge_idx._M_elems + 3),(ulong)local_d44);
                          pvVar20 = std::
                                    vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                                    ::operator[]((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                                                  *)pvVar4,(ulong)*pvVar19);
                          pvVar20->ref_pat_ = rp_split;
                          bVar6 = false;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            if (RVar9 != kQuad) {
              std::__cxx11::stringstream::stringstream(local_28b8);
              std::operator<<(local_28a8,"Illegal cell type");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_28d8,"false",&local_28d9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2900,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_2901);
              std::__cxx11::stringstream::str();
              lf::base::AssertionFailed(&local_28d8,&local_2900,0x162,&local_2928);
              std::__cxx11::string::~string((string *)&local_2928);
              std::__cxx11::string::~string((string *)&local_2900);
              std::allocator<char>::~allocator(&local_2901);
              std::__cxx11::string::~string((string *)&local_28d8);
              std::allocator<char>::~allocator(&local_28d9);
              prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar14,"this code should not be reached");
              __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            switch(edge_index_1) {
            case 0:
              pvVar23 = std::
                        vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                        ::operator[](local_30,(ulong)uVar10);
              pvVar23->ref_pat_ = rp_copy;
              break;
            case 1:
              pvVar23 = std::
                        vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                        ::operator[](local_30,(ulong)uVar10);
              pvVar23->ref_pat_ = rp_trisect;
              pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                  ((array<unsigned_int,_4UL> *)
                                   ((long)&sub_edges._M_extent._M_extent_value + 4),0);
              vVar12 = *pvVar19;
              pvVar23 = std::
                        vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                        ::operator[](local_30,(ulong)uVar10);
              pvVar23->anchor_ = vVar12;
              break;
            case 2:
              pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                  ((array<unsigned_int,_4UL> *)
                                   ((long)&sub_edges._M_extent._M_extent_value + 4),1);
              vVar12 = *pvVar19;
              pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                  ((array<unsigned_int,_4UL> *)
                                   ((long)&sub_edges._M_extent._M_extent_value + 4),0);
              if (vVar12 - *pvVar19 == 2) {
                pvVar23 = std::
                          vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                          ::operator[](local_30,(ulong)uVar10);
                pvVar23->ref_pat_ = rp_bisect;
                pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                    ((array<unsigned_int,_4UL> *)
                                     ((long)&sub_edges._M_extent._M_extent_value + 4),0);
                vVar12 = *pvVar19;
                pvVar23 = std::
                          vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                          ::operator[](local_30,(ulong)uVar10);
                pvVar23->anchor_ = vVar12;
              }
              else {
                pvVar23 = std::
                          vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                          ::operator[](local_30,(ulong)uVar10);
                pvVar23->ref_pat_ = rp_quadsect;
                pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                    ((array<unsigned_int,_4UL> *)
                                     ((long)&sub_edges._M_extent._M_extent_value + 4),0);
                vVar12 = *pvVar19;
                pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                    ((array<unsigned_int,_4UL> *)
                                     ((long)&sub_edges._M_extent._M_extent_value + 4),1);
                if ((vVar12 + 1 & 3) == *pvVar19) {
                  pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                      ((array<unsigned_int,_4UL> *)
                                       ((long)&sub_edges._M_extent._M_extent_value + 4),0);
                  vVar12 = *pvVar19;
                  pvVar23 = std::
                            vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                            ::operator[](local_30,(ulong)uVar10);
                  pvVar23->anchor_ = vVar12;
                }
                else {
                  pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                      ((array<unsigned_int,_4UL> *)
                                       ((long)&sub_edges._M_extent._M_extent_value + 4),1);
                  vVar12 = *pvVar19;
                  pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                      ((array<unsigned_int,_4UL> *)
                                       ((long)&sub_edges._M_extent._M_extent_value + 4),0);
                  if ((vVar12 + 1 & 3) != *pvVar19) {
                    std::__cxx11::stringstream::stringstream(local_22d0);
                    std::operator<<(local_22c0,"Quad: impossible situation for 2 split edges");
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_22f0,"false",&local_22f1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2318,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,&local_2319);
                    std::__cxx11::stringstream::str();
                    lf::base::AssertionFailed(&local_22f0,&local_2318,0x13d,&local_2340);
                    std::__cxx11::string::~string((string *)&local_2340);
                    std::__cxx11::string::~string((string *)&local_2318);
                    std::allocator<char>::~allocator(&local_2319);
                    std::__cxx11::string::~string((string *)&local_22f0);
                    std::allocator<char>::~allocator(&local_22f1);
                    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar14,"this code should not be reached");
                    __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  pvVar19 = std::array<unsigned_int,_4UL>::operator[]
                                      ((array<unsigned_int,_4UL> *)
                                       ((long)&sub_edges._M_extent._M_extent_value + 4),1);
                  vVar12 = *pvVar19;
                  pvVar23 = std::
                            vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                            ::operator[](local_30,(ulong)uVar10);
                  pvVar23->anchor_ = vVar12;
                }
              }
              break;
            case 3:
              pvVar23 = std::
                        vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                        ::operator[](local_30,(ulong)uVar10);
              pvVar23->ref_pat_ = rp_threeedge;
              pvVar21 = std::array<bool,_4UL>::operator[]
                                  ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),0);
              if ((*pvVar21 & 1U) == 0) {
                pvVar23 = std::
                          vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                          ::operator[](local_30,(ulong)uVar10);
                pvVar23->anchor_ = 2;
              }
              else {
                pvVar21 = std::array<bool,_4UL>::operator[]
                                    ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),1);
                if ((*pvVar21 & 1U) == 0) {
                  pvVar23 = std::
                            vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                            ::operator[](local_30,(ulong)uVar10);
                  pvVar23->anchor_ = 3;
                }
                else {
                  pvVar21 = std::array<bool,_4UL>::operator[]
                                      ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),2);
                  if ((*pvVar21 & 1U) == 0) {
                    pvVar23 = std::
                              vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                              ::operator[](local_30,(ulong)uVar10);
                    pvVar23->anchor_ = 0;
                  }
                  else {
                    pvVar21 = std::array<bool,_4UL>::operator[]
                                        ((array<bool,_4UL> *)(split_edge_idx._M_elems + 2),3);
                    if ((*pvVar21 & 1U) != 0) {
                      std::__cxx11::stringstream::stringstream(local_24c8);
                      std::operator<<(local_24b8,"Inconsistent split pattern");
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_24e8,"false",&local_24e9);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2510,
                                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                                 ,&local_2511);
                      std::__cxx11::stringstream::str();
                      lf::base::AssertionFailed(&local_24e8,&local_2510,0x150,&local_2538);
                      std::__cxx11::string::~string((string *)&local_2538);
                      std::__cxx11::string::~string((string *)&local_2510);
                      std::allocator<char>::~allocator(&local_2511);
                      std::__cxx11::string::~string((string *)&local_24e8);
                      std::allocator<char>::~allocator(&local_24e9);
                      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar14,"this code should not be reached");
                      __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pvVar23 = std::
                              vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                              ::operator[](local_30,(ulong)uVar10);
                    pvVar23->anchor_ = 1;
                  }
                }
              }
              break;
            case 4:
              pvVar23 = std::
                        vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                        ::operator[](local_30,(ulong)uVar10);
              pvVar23->ref_pat_ = rp_regular;
              break;
            default:
              std::__cxx11::stringstream::stringstream(local_26c0);
              poVar17 = std::operator<<(local_26b0,"Illegal number ");
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,edge_index_1);
              std::operator<<(poVar17," of split edges");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_26e0,"false",&local_26e1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2708,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_2709);
              std::__cxx11::stringstream::str();
              lf::base::AssertionFailed(&local_26e0,&local_2708,0x15b,&local_2730);
              std::__cxx11::string::~string((string *)&local_2730);
              std::__cxx11::string::~string((string *)&local_2708);
              std::allocator<char>::~allocator(&local_2709);
              std::__cxx11::string::~string((string *)&local_26e0);
              std::allocator<char>::~allocator(&local_26e1);
              prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar14,"this code should not be reached");
              __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end3);
        }
        if (bVar6) {
          PerformRefinement(this);
          initGeometryInParent(this);
          return;
        }
      } while( true );
    }
    ppEVar16 = __gnu_cxx::
               __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
               ::operator*(&__end2_1);
    local_698 = *ppEVar16;
    iVar11 = (*local_698->_vptr_Entity[4])();
    local_699.type_ = (RefElType)iVar11;
    RVar9 = lf::base::RefEl::operator_cast_to_RefElType(&local_699);
    local_69a = lf::base::RefEl::kSegment();
    RVar7 = lf::base::RefEl::operator_cast_to_RefElType(&local_69a);
    if (RVar9 != RVar7) {
      std::__cxx11::stringstream::stringstream(local_828);
      std::operator<<(local_818,"Wrong type for an edge");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_848,"edge->RefEl() == lf::base::RefEl::kSegment()",&local_849);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_870,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                 ,&local_871);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_848,&local_870,0x8e,(string *)local_898);
      std::__cxx11::string::~string((string *)local_898);
      std::__cxx11::string::~string((string *)&local_870);
      std::allocator<char>::~allocator(&local_871);
      std::__cxx11::string::~string((string *)&local_848);
      std::allocator<char>::~allocator(&local_849);
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar14,"this code should not be reached");
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ed_ci._4_4_ = (*(code *)(finest_point_ci->
                            super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                            )._M_impl.super__Vector_impl_data._M_start[5])
                            (finest_point_ci,local_698);
    local_8a8 = std::
                vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                ::operator[]((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                              *)finest_cell_ci,(ulong)ed_ci._4_4_);
    if (local_8a8->ref_pat_ != rp_nil) break;
    this_01 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::back(&this->edge_marked_);
    _auStack_ab0 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,(ulong)ed_ci._4_4_);
    bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_ab0);
    if (bVar6) {
      local_8a8->ref_pat_ = rp_split;
    }
    else {
      local_8a8->ref_pat_ = rp_copy;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2_1);
  }
  std::__cxx11::stringstream::stringstream(local_a30);
  poVar17 = std::operator<<(local_a20,"Edge ");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,ed_ci._4_4_);
  std::operator<<(poVar17," already refined!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a50,"ed_ci.ref_pat_ == RefPat::rp_nil",&local_a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,&local_a79);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_a50,&local_a78,0x92,&local_aa0);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator(&local_a79);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator(&local_a51);
  prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar14,"this code should not be reached");
  __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MeshHierarchy::RefineMarked() {
  // Target the finest mesh
  const lf::mesh::Mesh &finest_mesh(*meshes_.back());
  // Arrays containing refinement information for finest mesh
  std::vector<PointChildInfo> &finest_point_ci(point_child_infos_.back());
  std::vector<EdgeChildInfo> &finest_edge_ci(edge_child_infos_.back());
  std::vector<CellChildInfo> &finest_cell_ci(cell_child_infos_.back());

  LF_VERIFY_MSG(finest_point_ci.size() == finest_mesh.NumEntities(2),
                "length mismatch PointChildInfo vector");
  LF_VERIFY_MSG(finest_edge_ci.size() == finest_mesh.NumEntities(1),
                "length mismatch EdgeChildInfo vector");
  LF_VERIFY_MSG(finest_cell_ci.size() == finest_mesh.NumEntities(0),
                "length mismatch CellChildInfo vector");

  // Flag all points as to be copied
  for (const mesh::Entity *point : finest_mesh.Entities(2)) {
    const glb_idx_t point_index = finest_mesh.Index(*point);
    PointChildInfo &pt_child_info(finest_point_ci[point_index]);
    // Set the information about a point's children except the child pointer
    pt_child_info.ref_pat = RefPat::rp_copy;
  }

  // Set the split refinement patterrn for all marked edges
  for (const lf::mesh::Entity *edge : finest_mesh.Entities(1)) {
    LF_VERIFY_MSG(edge->RefEl() == lf::base::RefEl::kSegment(),
                  "Wrong type for an edge");
    const glb_idx_t edge_index = finest_mesh.Index(*edge);
    EdgeChildInfo &ed_ci(finest_edge_ci[edge_index]);
    LF_VERIFY_MSG(ed_ci.ref_pat_ == RefPat::rp_nil,
                  "Edge " << edge_index << " already refined!");
    if ((edge_marked_.back())[edge_index]) {
      // Edge is to be refined
      ed_ci.ref_pat_ = RefPat::rp_split;
    } else {
      // Just copy edge
      ed_ci.ref_pat_ = RefPat::rp_copy;
    }
  }
  // Now all edges are initially marked to be split or copied

  // To keep the mesh conforming refinement might have to propagate
  // This is achieved in the following REPEAT ... UNTIL loop.
  bool refinement_complete;
  do {
    refinement_complete = true;
    // Visit all cells and update their refinement patterns
    for (const lf::mesh::Entity *cell : finest_mesh.Entities(0)) {
      // Obtain unique index of current cell
      const glb_idx_t cell_index = finest_mesh.Index(*cell);
      // Detailed description of refinement status
      const CellChildInfo &cell_child_info(finest_cell_ci[cell_index]);

      // Global indices of edges
      std::array<glb_idx_t, 4> cell_edge_indices{};

      // Find edges which are marked as split
      std::array<bool, 4> edge_split{{false, false, false, false}};
      // Local indices of edges marked as split
      std::array<sub_idx_t, 4> split_edge_idx{};
      // Array of references to edge sub-entities of current cell
      const std::span<const lf::mesh::Entity *const> sub_edges =
          cell->SubEntities(1);
      const size_type num_edges = cell->RefEl().NumSubEntities(1);
      LF_VERIFY_MSG(num_edges <= 4, "Too many edges = " << num_edges);
      // Obtain information about current splitting pattern of
      // the edges of the cell. Count edges that will be split.
      size_type split_edge_cnt = 0;
      for (int k = 0; k < num_edges; k++) {
        const glb_idx_t edge_index = finest_mesh.Index(*sub_edges[k]);
        cell_edge_indices[k] = edge_index;
        edge_split[k] =
            (finest_edge_ci[edge_index].ref_pat_ == RefPat::rp_split);
        if (edge_split[k]) {
          split_edge_idx[split_edge_cnt] = k;
          split_edge_cnt++;
        }
      }
      switch (cell->RefEl()) {
        case lf::base::RefEl::kTria(): {
          // Case of a triangular cell: In this case bisection refinement
          // is performed starting with the refinement edge.
          // Local index of refinement edge for the current triangle, also
          // called the "anchor edge" in the case of repeated  bisection
          const sub_idx_t anchor = refinement_edges_.back()[cell_index];
          LF_VERIFY_MSG(anchor < 3, "Illegal anchor = " << anchor);

          // Refinement edge will always be the anchor edge
          finest_cell_ci[cell_index].anchor_ = anchor;
          const sub_idx_t mod_0 = anchor;
          const sub_idx_t mod_1 = (anchor + 1) % 3;
          const sub_idx_t mod_2 = (anchor + 2) % 3;
          // Flag tuple indicating splitting status of an edge: true <-> split
          const std::tuple<bool, bool, bool> split_status(
              {edge_split[mod_0], edge_split[mod_1], edge_split[mod_2]});

          // Determine updated refinement pattern for triangle depending on the
          // splitting status of its edges. If the triangle is subdivided, the
          // refinement must always be split in a first bisection step, even if
          // it may not have been marked as split. In this case refinement may
          // spread to neighboring cells and we have to iterative once more.
          // Therefore the refinement_complete flag has to be set to 'false'.

          if (split_status ==
              std::tuple<bool, bool, bool>({false, false, false})) {
            // No edge to be split: just copy triangle
            LF_VERIFY_MSG(split_edge_cnt == 0, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_copy;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({true, false, false})) {
            // Only refinement edge has to be split by a single bisection
            // No additional edge will be split
            LF_VERIFY_MSG(split_edge_cnt == 1, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_bisect;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({true, true, false})) {
            // Trisection refinement, no extra splitting of edges
            LF_VERIFY_MSG(split_edge_cnt == 2, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_trisect;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({false, true, false})) {
            // Trisection refinement, triggering splitting of refinement edge
            LF_VERIFY_MSG(split_edge_cnt == 1, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_trisect;
            finest_edge_ci[cell_edge_indices[anchor]].ref_pat_ =
                RefPat::rp_split;
            refinement_complete = false;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({true, false, true})) {
            // Trisection refinement (other side), no extra splitting of edges
            LF_VERIFY_MSG(split_edge_cnt == 2, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_trisect_left;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({false, false, true})) {
            // Trisection refinement (other side), triggering splitting of
            // refinement edge
            LF_VERIFY_MSG(split_edge_cnt == 1, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_trisect_left;
            finest_edge_ci[cell_edge_indices[anchor]].ref_pat_ =
                RefPat::rp_split;
            refinement_complete = false;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({true, true, true})) {
            // All edges of the triangle are to be split
            // If the implementation relies on quadsection refinement, the the
            // child triangles may become  more and more distorted! Thus it is
            // advisable to employ regular refinement.
            LF_VERIFY_MSG(split_edge_cnt == 3, "Wrong number of split edges");
            // OLD IMPLEMENTATION
            // finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_quadsect;
            // NEW IMPLEMENTATION
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_regular;
          } else if (split_status ==
                     std::tuple<bool, bool, bool>({false, true, true})) {
            // Quadsection refinement requiring splitting of refinement edge
            LF_VERIFY_MSG(split_edge_cnt == 2, "Wrong number of split edges");
            finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_quadsect;
            finest_edge_ci[cell_edge_indices[anchor]].ref_pat_ =
                RefPat::rp_split;
            refinement_complete = false;
          } else {
            LF_VERIFY_MSG(false, "Impossible case");
          }
          break;
        }  // end case of a triangle
        case lf::base::RefEl::kQuad(): {
          // There is no refinement edge for quadrilaterals and so no extra edge
          // splitting will be necessary. The refinement pattern for a
          // quadrilateral will be determined from the number of edges split and
          // their location to each other.
          switch (split_edge_cnt) {
            case 0: {
              // No edge split: quadrilateral has to be copied
              finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_copy;
              break;
            }
            case 1: {
              // One edge split: trisection refinement of the quadrilateral
              // Anchor edge is the split edge
              finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_trisect;
              finest_cell_ci[cell_index].anchor_ = split_edge_idx[0];
              break;
            }
            case 2: {
              if ((split_edge_idx[1] - split_edge_idx[0]) == 2) {
                // If the two split edges are opposite to each other, then
                // bisection of the quadrilateral is the right refinement
                // pattern.
                finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_bisect;
                finest_cell_ci[cell_index].anchor_ = split_edge_idx[0];
              } else {
                // Tthe two split edges are adjacent, this case can be
                // accommodated by quadsection refinement. Anchor is the split
                // edge with the lower index (modulo 4).
                finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_quadsect;
                if (((split_edge_idx[0] + 1) % 4) == split_edge_idx[1]) {
                  finest_cell_ci[cell_index].anchor_ = split_edge_idx[0];
                } else if (((split_edge_idx[1] + 1) % 4) == split_edge_idx[0]) {
                  finest_cell_ci[cell_index].anchor_ = split_edge_idx[1];
                } else {
                  LF_VERIFY_MSG(false,
                                "Quad: impossible situation for 2 split edges");
                }
              }
              break;
            }
            case 3: {
              // Three edges of the quadrilateral are split, which can be
              // accommodated only by the rp_threeedge refinement pattern
              // anchor is the edge with the middle index
              finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_threeedge;
              if (!edge_split[0]) {  // Split edges 1,2,3, middle edge 2
                finest_cell_ci[cell_index].anchor_ = 2;
              } else if (!edge_split[1]) {  // Split edges 0,2,3, middle edge 3
                finest_cell_ci[cell_index].anchor_ = 3;
              } else if (!edge_split[2]) {  // Split edges 0,1,3, middle edge 0
                finest_cell_ci[cell_index].anchor_ = 0;
              } else if (!edge_split[3]) {  // Split edges 0,1,2, middle edge 1
                finest_cell_ci[cell_index].anchor_ = 1;
              } else {
                LF_VERIFY_MSG(false, "Inconsistent split pattern");
              }
              break;
            }
            case 4: {
              // All edges are split => regular refinement
              finest_cell_ci[cell_index].ref_pat_ = RefPat::rp_regular;
              break;
            }
            default: {
              LF_VERIFY_MSG(false, "Illegal number " << split_edge_cnt
                                                     << " of split edges");
              break;
            }
          }  // end switch split_edge_cnt
          break;
        }  // end case of a quadrilateral
        default: {
          LF_VERIFY_MSG(false, "Illegal cell type");
          break;
        }
      }  // end switch cell type
    }  // end loop over cells
  } while (!refinement_complete);

  // Create finer mesh according to set refinment edges
  PerformRefinement();
  // Finish initialization
  initGeometryInParent();
}